

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPreviewImage.cpp
# Opt level: O3

void testPreviewImage(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  pointer pcVar3;
  bool bVar4;
  long *__s;
  long *__s_00;
  char cVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  void *pvVar9;
  size_t sVar10;
  Header *pHVar11;
  long lVar12;
  int *piVar13;
  void *pvVar14;
  int x;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int y;
  int iVar19;
  uint uVar20;
  long lVar21;
  PreviewImage preview1;
  string filename2;
  string filename1;
  RgbaInputFile file1;
  Header header;
  RgbaOutputFile file2;
  int local_4e0 [2];
  long local_4d8;
  long *local_4d0 [2];
  long local_4c0 [2];
  long *local_4b0 [2];
  long local_4a0 [2];
  long local_490;
  ulong local_488;
  Rgba local_480 [8];
  Rgba local_440 [2];
  char local_430 [16];
  uint auStack_420 [122];
  Rgba local_238 [2];
  char local_228 [16];
  byte abStack_218 [488];
  
  local_4b0[0] = local_4a0;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4b0,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_4b0);
  local_4d0[0] = local_4c0;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d0,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing preview image attribute",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  __s_00 = local_4b0[0];
  __s = local_4d0[0];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading file ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_piz.exr"
             ,0x77);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  iVar6 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile
            ((RgbaInputFile *)local_480,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_piz.exr"
             ,iVar6);
  Imf_3_4::RgbaInputFile::header();
  cVar5 = Imf_3_4::Header::hasPreviewImage();
  if (cVar5 != '\0') {
    __assert_fail("!file1.header ().hasPreviewImage ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                  ,0x39,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  piVar8 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar6 = *piVar8;
  lVar21 = ((long)piVar8[2] - (long)iVar6) + 1;
  iVar19 = piVar8[1];
  iVar7 = ((piVar8[3] - iVar19) + 1) * (int)lVar21;
  uVar18 = 0xffffffffffffffff;
  if (-1 < iVar7) {
    uVar18 = (long)iVar7 * 8;
  }
  pvVar9 = operator_new__(uVar18);
  uVar18 = (long)pvVar9 + (long)(iVar19 * (int)lVar21) * -8 + (long)iVar6 * -8;
  Imf_3_4::RgbaInputFile::setFrameBuffer(local_480,uVar18,1);
  Imf_3_4::RgbaInputFile::readPixels((int)local_480,piVar8[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"generating preview image",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  iVar19 = 0;
  Imf_3_4::PreviewImage::PreviewImage((PreviewImage *)local_4e0,0x80,0x40,(PreviewRgba *)0x0);
  iVar6 = -0x80000000;
  do {
    iVar15 = 0;
    iVar7 = iVar6;
    do {
      *(int *)(local_4d8 + (ulong)(uint)(local_4e0[0] * iVar19 + iVar15) * 4) = iVar7;
      iVar15 = iVar15 + 1;
      iVar7 = iVar7 + 0x10002;
    } while (iVar15 != 0x80);
    iVar19 = iVar19 + 1;
    iVar6 = iVar6 + 0x10400;
  } while (iVar19 != 0x40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing file ",0xd);
  if (__s_00 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1eefa0);
  }
  else {
    sVar10 = strlen((char *)__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s_00,sVar10);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pHVar11 = (Header *)Imf_3_4::RgbaInputFile::header();
  Imf_3_4::Header::Header((Header *)local_440,pHVar11);
  Imf_3_4::Header::setPreviewImage((PreviewImage *)local_440);
  iVar6 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_238,(char *)__s_00,(Header *)local_440,WRITE_RGBA,iVar6);
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_238,uVar18,1);
  if (piVar8[1] <= piVar8[3]) {
    iVar6 = piVar8[1] + -1;
    do {
      Imf_3_4::RgbaOutputFile::writePixels((int)local_238);
      iVar6 = iVar6 + 1;
    } while (iVar6 < piVar8[3]);
  }
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_238);
  Imf_3_4::Header::~Header((Header *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading file ",0xd);
  if (__s_00 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1eefa0);
  }
  else {
    sVar10 = strlen((char *)__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s_00,sVar10);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  iVar6 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_440,(char *)__s_00,iVar6);
  Imf_3_4::RgbaInputFile::header();
  cVar5 = Imf_3_4::Header::hasPreviewImage();
  if (cVar5 == '\0') {
    __assert_fail("file2.header ().hasPreviewImage ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                  ,99,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  Imf_3_4::RgbaInputFile::header();
  lVar12 = Imf_3_4::Header::previewImage();
  lVar12 = *(long *)(lVar12 + 8);
  lVar16 = 0;
  do {
    if (*(char *)(local_4d8 + lVar16 * 4) != *(char *)(lVar12 + lVar16 * 4)) {
      __assert_fail("preview1.pixels ()[i].r == preview2.pixels ()[i].r",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x69,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (*(char *)(local_4d8 + 1 + lVar16 * 4) != *(char *)(lVar12 + 1 + lVar16 * 4)) {
      __assert_fail("preview1.pixels ()[i].g == preview2.pixels ()[i].g",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x6a,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (*(char *)(local_4d8 + 2 + lVar16 * 4) != *(char *)(lVar12 + 2 + lVar16 * 4)) {
      __assert_fail("preview1.pixels ()[i].b == preview2.pixels ()[i].b",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x6b,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (*(char *)(local_4d8 + 3 + lVar16 * 4) != *(char *)(lVar12 + 3 + lVar16 * 4)) {
      __assert_fail("preview1.pixels ()[i].a == preview2.pixels ()[i].a",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x6c,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x2000);
  piVar13 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar6 = *piVar8;
  local_490 = lVar21;
  local_488 = uVar18;
  if ((((iVar6 != *piVar13) || (iVar19 = piVar8[1], iVar19 != piVar13[1])) ||
      (piVar8[2] != piVar13[2])) || (piVar8[3] != piVar13[3])) {
    __assert_fail("dw == file2.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                  ,0x6f,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  iVar7 = (piVar8[2] - iVar6) + 1;
  uVar20 = ((piVar8[3] - iVar19) + 1) * iVar7;
  uVar18 = 0xffffffffffffffff;
  if (-1 < (int)uVar20) {
    uVar18 = (long)(int)uVar20 * 8;
  }
  pvVar14 = operator_new__(uVar18);
  Imf_3_4::RgbaInputFile::setFrameBuffer
            (local_440,(long)pvVar14 + (long)(iVar19 * iVar7) * -8 + (long)iVar6 * -8,1);
  Imf_3_4::RgbaInputFile::readPixels((int)local_440,piVar8[1]);
  uVar18 = local_488;
  if (0 < (int)uVar20) {
    uVar17 = 0;
    do {
      fVar2 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar9 + uVar17 * 8) * 4);
      pfVar1 = (float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar14 + uVar17 * 8) * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("pixels1[i].r == pixels2[i].r",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                      ,0x7c,
                      "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                     );
      }
      fVar2 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar9 + uVar17 * 8 + 2) * 4);
      pfVar1 = (float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar14 + uVar17 * 8 + 2) * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("pixels1[i].g == pixels2[i].g",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                      ,0x7d,
                      "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                     );
      }
      fVar2 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar9 + uVar17 * 8 + 4) * 4);
      pfVar1 = (float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar14 + uVar17 * 8 + 4) * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("pixels1[i].b == pixels2[i].b",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                      ,0x7e,
                      "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                     );
      }
      fVar2 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar9 + uVar17 * 8 + 6) * 4);
      pfVar1 = (float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar14 + uVar17 * 8 + 6) * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("pixels1[i].a == pixels2[i].a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                      ,0x7f,
                      "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                     );
      }
      uVar17 = uVar17 + 1;
    } while (uVar20 != uVar17);
  }
  operator_delete__(pvVar14);
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing file ",0xd);
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1eefa0);
  }
  else {
    sVar10 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar10);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pHVar11 = (Header *)Imf_3_4::RgbaInputFile::header();
  Imf_3_4::Header::Header((Header *)local_440,pHVar11);
  Imf_3_4::PreviewImage::PreviewImage((PreviewImage *)local_238,0x80,0x40,(PreviewRgba *)0x0);
  Imf_3_4::Header::setPreviewImage((PreviewImage *)local_440);
  Imf_3_4::PreviewImage::~PreviewImage((PreviewImage *)local_238);
  iVar6 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_238,(char *)__s,(Header *)local_440,WRITE_RGBA,iVar6);
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_238,uVar18,1);
  if (piVar8[1] <= piVar8[3]) {
    iVar6 = piVar8[1];
    do {
      Imf_3_4::RgbaOutputFile::writePixels((int)local_238);
      iVar19 = piVar8[3];
      if (iVar6 == (piVar8[1] + iVar19) / 2) {
        Imf_3_4::RgbaOutputFile::updatePreviewImage((PreviewRgba *)local_238);
        iVar19 = piVar8[3];
      }
      bVar4 = iVar6 < iVar19;
      iVar6 = iVar6 + 1;
    } while (bVar4);
  }
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_238);
  Imf_3_4::Header::~Header((Header *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing files ",0x10);
  if (__s_00 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1eefa0);
  }
  else {
    sVar10 = strlen((char *)__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s_00,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1eefa0);
  }
  else {
    sVar10 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar10);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::ifstream::ifstream(local_440);
  std::ifstream::ifstream(local_238);
  std::filebuf::open(local_430,(_Ios_Openmode)__s_00);
  std::filebuf::open(local_228,(_Ios_Openmode)__s);
  while( true ) {
    iVar6 = std::istream::get();
    iVar19 = std::istream::get();
    uVar20 = *(uint *)((long)auStack_420 + *(long *)((long)local_440[0] + -0x18));
    if ((uVar20 & 2) != 0) {
      std::ifstream::~ifstream(local_238);
      std::ifstream::~ifstream(local_440);
      remove((char *)__s_00);
      remove((char *)__s);
      Imf_3_4::PreviewImage::~PreviewImage((PreviewImage *)local_4e0);
      operator_delete__(pvVar9);
      Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_480);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      if (local_4d0[0] != local_4c0) {
        operator_delete(local_4d0[0],local_4c0[0] + 1);
      }
      if (local_4b0[0] != local_4a0) {
        operator_delete(local_4b0[0],local_4a0[0] + 1);
      }
      return;
    }
    if (iVar6 != iVar19) break;
    if (((uVar20 & 5) != 0) || ((abStack_218[*(long *)((long)local_238[0] + -0x18)] & 5) != 0)) {
      __assert_fail("!!file2 && !!file3",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0xa6,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
  }
  __assert_fail("c2 == c3",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                ,0xa5,
                "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
               );
}

Assistant:

void
testPreviewImage (const std::string& tempDir)
{
    std::string filename1 = tempDir + "imf_preview1.exr";
    std::string filename2 = tempDir + "imf_preview2.exr";

    try
    {
        cout << "Testing preview image attribute" << endl;

        readWriteFiles (
            ILM_IMF_TEST_IMAGEDIR "comp_piz.exr",
            filename1.c_str (),
            filename2.c_str ());

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}